

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest::InflateAndCheck
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ZLIBBufferCompressorTest *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *input_buffer,ByteBuffer *compressed
          )

{
  bool bVar1;
  long lVar2;
  uchar *__first;
  char *message;
  AssertionResult gtest_ar;
  ByteBuffer decompressed;
  ZLIBBufferInflator decompressor;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  allocator_type local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  ByteBuffer local_c8 [48];
  ZLIBBufferInflator local_98 [120];
  
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_98);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(local_c8);
  lVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  __first = (uchar *)bidfx_public_api::tools::ByteBuffer::ToArray();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             __first + lVar2,local_d8);
  if (__first != (uchar *)0x0) {
    operator_delete(__first,1);
  }
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)local_d8,"input_buffer","result_vector",input_buffer,__return_storage_ptr__
            );
  if (local_d8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_c8);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> ZLIBBufferCompressorTest::InflateAndCheck(std::vector<unsigned char>& input_buffer,
                                                                     bidfx_public_api::tools::ByteBuffer& compressed)
{
    ZLIBBufferInflator decompressor;
    ByteBuffer decompressed = decompressor.Inflate(compressed);
    size_t num_bytes = decompressed.ReadableBytes();
    unsigned char* result_array = decompressed.ToArray();
    std::vector<unsigned char> result_vector = std::vector<unsigned char>(result_array, result_array + num_bytes);
    delete result_array;
    EXPECT_EQ(input_buffer, result_vector);
    return result_vector;
}